

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O3

void add_linear_comb_weighted<double,int,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *res,double *Xc,
               int *Xc_ind,int *Xc_indptr,double *coef,double x_sd,double x_mean,double *fill_val,
               MissingAction missing_action,double *buffer_arr,size_t *buffer_NAs,bool first_run,
               vector<double,_std::allocator<double>_> *w)

{
  pointer pdVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  pointer __first;
  pointer __last;
  ulong uVar4;
  pointer pdVar5;
  size_t sVar6;
  size_type sVar7;
  ulong uVar8;
  size_type __n;
  long lVar9;
  size_type __n_00;
  double dVar10;
  undefined1 auVar11 [16];
  double dVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  allocator_type local_f9;
  size_t *local_f8;
  double *local_f0;
  double *local_e8;
  size_t local_e0;
  ulong local_d8;
  double *local_d0;
  double *local_c8;
  vector<double,_std::allocator<double>_> *local_c0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> sorted_ix;
  vector<double,_std::allocator<double>_> obs_weight;
  vector<double,_std::allocator<double>_> denseX;
  
  local_d8 = (ulong)missing_action;
  if (missing_action == Fail || !first_run) {
    add_linear_comb<double,int>
              (ix_arr,st,end,col_num,res,Xc,Xc_ind,Xc_indptr,coef,x_sd,x_mean,fill_val,
               missing_action,buffer_arr,buffer_NAs,first_run);
    return;
  }
  local_c0 = w;
  local_f0 = buffer_arr;
  local_e8 = coef;
  __n = (end - st) + 1;
  obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d0 = res;
  std::vector<double,_std::allocator<double>_>::vector
            (&denseX,__n,(value_type_conflict *)&obs_weight,(allocator_type *)&sorted_ix);
  local_f8 = ix_arr;
  local_e0 = col_num;
  local_c8 = Xc;
  todense<double,int>(ix_arr,st,end,col_num,Xc,Xc_ind,Xc_indptr,
                      denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
  std::vector<double,_std::allocator<double>_>::vector(&obs_weight,__n,(allocator_type *)&sorted_ix)
  ;
  if (st <= end) {
    pdVar1 = (local_c0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    sVar6 = st;
    do {
      *pdVar5 = pdVar1[local_f8[sVar6]];
      sVar6 = sVar6 + 1;
      pdVar5 = pdVar5 + 1;
    } while (sVar6 <= end);
  }
  local_c0 = (vector<double,_std::allocator<double>_> *)0x0;
  bVar2 = true;
  if (__n != 0) {
    sVar7 = 0;
    __n_00 = __n;
    do {
      dVar10 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[sVar7];
      if (0x7fefffffffffffff < (ulong)ABS(dVar10)) {
        denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[sVar7] =
             denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[__n_00 - 1];
        denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
        _M_start[__n_00 - 1] = dVar10;
        dVar10 = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[sVar7];
        obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[sVar7] =
             obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start[__n_00 - 1];
        obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[__n_00 - 1] = dVar10;
        __n_00 = __n_00 - 1;
      }
      sVar7 = sVar7 + 1;
    } while (__n != sVar7);
    if (__n_00 != 0) {
      dVar10 = 0.0;
      lVar9 = 0;
      do {
        dVar10 = dVar10 + *(double *)
                           ((long)obs_weight.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar9);
        lVar9 = lVar9 + 8;
      } while (__n_00 * 8 - lVar9 != 0);
      local_c0 = (vector<double,_std::allocator<double>_> *)(dVar10 * 0.5);
      bVar2 = __n_00 == 0;
      goto LAB_0018ce2a;
    }
  }
  __n_00 = 0;
LAB_0018ce2a:
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&sorted_ix,__n_00,&local_f9);
  __last = sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  __first = sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
  auVar3 = _DAT_0036e1f0;
  if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start !=
      sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    uVar4 = ((long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
            (long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start) - 8;
    auVar14._8_4_ = (int)uVar4;
    auVar14._0_8_ = uVar4;
    auVar14._12_4_ = (int)(uVar4 >> 0x20);
    auVar11._0_8_ = uVar4 >> 3;
    auVar11._8_8_ = auVar14._8_8_ >> 3;
    uVar8 = 0;
    auVar11 = auVar11 ^ _DAT_0036e1f0;
    auVar13 = _DAT_0036e1e0;
    do {
      auVar14 = auVar13 ^ auVar3;
      if ((bool)(~(auVar14._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar14._0_4_ ||
                  auVar11._4_4_ < auVar14._4_4_) & 1)) {
        sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8] = uVar8;
      }
      if ((auVar14._12_4_ != auVar11._12_4_ || auVar14._8_4_ <= auVar11._8_4_) &&
          auVar14._12_4_ <= auVar11._12_4_) {
        sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar8 + 1] = uVar8 + 1;
      }
      uVar8 = uVar8 + 2;
      lVar9 = auVar13._8_8_;
      auVar13._0_8_ = auVar13._0_8_ + 2;
      auVar13._8_8_ = lVar9 + 2;
    } while (((uVar4 >> 3) + 2 & 0xfffffffffffffffe) != uVar8);
    uVar4 = (long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start >> 3;
    lVar9 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar9 == 0; lVar9 = lVar9 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<double,int,std::vector<double,std::allocator<double>>,double>(unsigned_long_const*,unsigned_long,unsigned_long,unsigned_long,double*,double_const*,int_const*,int_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_start,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                 .super__Vector_impl_data._M_finish,(ulong)(((uint)lVar9 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:906:19)>
                )&denseX);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<add_linear_comb_weighted<double,int,std::vector<double,std::allocator<double>>,double>(unsigned_long_const*,unsigned_long,unsigned_long,unsigned_long,double*,double_const*,int_const*,int_const*,double&,double,double,double&,MissingAction,double*,unsigned_long*,bool,std::vector<double,std::allocator<double>>&)::_lambda(unsigned_long,unsigned_long)_1_>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__last,(_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_david_cortes[P]isotree_src_mult_hpp:906:19)>
                         )&denseX);
  }
  dVar10 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start
           [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_finish[-1]];
  *fill_val = dVar10;
  if (!bVar2) {
    dVar12 = 0.0;
    uVar4 = 0;
    do {
      dVar12 = dVar12 + obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start[uVar4]];
      if ((double)local_c0 <= dVar12) {
        dVar10 = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar4]];
        if (((dVar12 == (double)local_c0) && (!NAN(dVar12) && !NAN((double)local_c0))) &&
           (uVar4 < __n_00 - 1)) {
          dVar10 = dVar10 + (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data._M_start
                             [sorted_ix.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar4 + 1]] - dVar10) * 0.5;
        }
        *fill_val = dVar10;
        break;
      }
      uVar4 = uVar4 + 1;
    } while (__n_00 != uVar4);
  }
  *fill_val = (*local_e8 / x_sd) * (dVar10 - x_mean);
  if (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_finish !=
      obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start) {
    obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  }
  if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish =
         sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  add_linear_comb<double,int>
            (local_f8,st,end,local_e0,local_d0,local_c8,Xc_ind,Xc_indptr,local_e8,x_sd,x_mean,
             fill_val,(MissingAction)local_d8,local_f0,buffer_NAs,false);
  if (sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(sorted_ix.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)sorted_ix.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)sorted_ix.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
      ._M_start != (pointer)0x0) {
    operator_delete(obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)obs_weight.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)denseX.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void add_linear_comb_weighted(const size_t *restrict ix_arr, size_t st, size_t end, size_t col_num, double *restrict res,
                              const real_t_ *restrict Xc, const sparse_ix *restrict Xc_ind, const sparse_ix *restrict Xc_indptr,
                              double &restrict coef, double x_sd, double x_mean, double &restrict fill_val, MissingAction missing_action,
                              double *restrict buffer_arr, size_t *restrict buffer_NAs, bool first_run, mapping &restrict w)
{
    /* TODO: there's likely a better way of doing this directly with sparse inputs.
       Think about some way of doing it efficiently. */
    if (first_run && missing_action != Fail)
    {
        std::vector<double> denseX(end-st+1, 0.);
        todense(ix_arr, st, end,
                col_num, Xc, Xc_ind, Xc_indptr,
                denseX.data());
        std::vector<double> obs_weight(end-st+1);
        for (size_t row = st; row <= end; row++)
            obs_weight[row - st] = w[ix_arr[row]];

        size_t end_new = end - st + 1;
        for (size_t ix = 0; ix < end-st+1; ix++)
        {
            if (unlikely(is_na_or_inf(denseX[ix])))
            {
                std::swap(denseX[ix], denseX[--end_new]);
                std::swap(obs_weight[ix], obs_weight[end_new]);
            }
        }

        ldouble_safe cumw = std::accumulate(obs_weight.begin(), obs_weight.begin() + end_new, (ldouble_safe)0);
        ldouble_safe mid_point = cumw / (ldouble_safe)2;
        std::vector<size_t> sorted_ix(end_new);
        std::iota(sorted_ix.begin(), sorted_ix.end(), (size_t)0);
        std::sort(sorted_ix.begin(), sorted_ix.end(),
                  [&denseX](const size_t a, const size_t b){return denseX[a] < denseX[b];});
        ldouble_safe currw = 0;
        fill_val = denseX[sorted_ix.back()]; /* <- will overwrite later */
        /* TODO: is this median calculation correct? should it do a weighted interpolation? */
        for (size_t ix = 0; ix < end_new; ix++)
        {
            currw += obs_weight[sorted_ix[ix]];
            if (currw >= mid_point)
            {
                if (currw == mid_point && ix < end_new-1)
                    fill_val = denseX[sorted_ix[ix]] + (denseX[sorted_ix[ix+1]] - denseX[sorted_ix[ix]]) / 2.0;
                else
                    fill_val = denseX[sorted_ix[ix]];
                break;
            }
        }

        fill_val = (fill_val - x_mean) * (coef / x_sd);
        denseX.clear();
        obs_weight.clear();
        sorted_ix.clear();
        
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, false);
    }

    else
    {
        add_linear_comb(ix_arr, st, end, col_num, res,
                        Xc, Xc_ind, Xc_indptr,
                        coef, x_sd, x_mean, fill_val, missing_action,
                        buffer_arr, buffer_NAs, first_run);
    }
}